

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyFindXmlDecl(TidyDocImpl *doc)

{
  Node *pNVar1;
  
  if (doc == (TidyDocImpl *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    pNVar1 = (doc->root).content;
  }
  for (; (pNVar1 != (Node *)0x0 && (pNVar1->type != XmlDecl)); pNVar1 = pNVar1->next) {
  }
  return pNVar1;
}

Assistant:

Node *TY_(FindXmlDecl)(TidyDocImpl* doc)
{
    Node *node;
    for ( node = (doc ? doc->root.content : NULL);
          node && !(node->type == XmlDecl);
          node = node->next )
        /**/;

    return node;
}